

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O2

void get_esis_after_loss(int nESIs,uint32_t *ESIs,float loss)

{
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)nESIs;
  if (nESIs < 1) {
    uVar3 = uVar4;
  }
  uVar2 = 0xffffffff;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    do {
      uVar2 = uVar2 + 1;
      iVar1 = rand();
    } while ((float)iVar1 * 4.656613e-10 < loss);
    ESIs[uVar4] = uVar2;
  }
  return;
}

Assistant:

void get_esis_after_loss(int nESIs, uint32_t* ESIs, float loss)
{
	int esi = -1;
	for (int j = 0; j < nESIs; ++j) {
		do {
			++esi;
		} while (rand() / (RAND_MAX + 1.0) < loss);
		ESIs[j] = esi;
	}
}